

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O3

void __thiscall
Assimp::MDLImporter::GenerateOutputMeshes_3DGS_MDL7
          (MDLImporter *this,IntGroupData_MDL7 *groupData,IntSplitGroupData_MDL7 *splitGroupData)

{
  aiVector3D **__s;
  size_t __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **ppvVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  pointer pIVar3;
  pointer paVar4;
  IntBone_MDL7 *pIVar5;
  vector<aiMesh*,std::allocator<aiMesh*>> *this_00;
  iterator __position;
  pointer pvVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  pointer pvVar22;
  uint uVar23;
  aiMesh *paVar24;
  ulong *puVar25;
  aiFace *paVar26;
  aiVector3D *paVar27;
  uint *puVar28;
  long lVar29;
  Logger *this_01;
  aiBone **ppaVar30;
  aiBone *paVar31;
  aiVertexWeight *__s_00;
  pointer ppaVar32;
  aiFace *paVar33;
  pointer ppaVar34;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  const_iterator k;
  ulong uVar38;
  pointer pvVar39;
  int iVar40;
  aiMesh *pcMesh;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  aaiVWeightList;
  aiMesh *local_498;
  ulong local_490;
  ulong local_488;
  IntSplitGroupData_MDL7 *local_480;
  char *local_478;
  uint local_46c;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_468;
  IntSharedData_MDL7 *local_450;
  ulong local_448;
  IntBone_MDL7 **local_440;
  uint local_434;
  undefined1 local_430 [1024];
  
  local_450 = splitGroupData->shared;
  ppaVar32 = (local_450->pcMats).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppaVar34 = (local_450->pcMats).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppaVar34 != ppaVar32) {
    local_448 = (ulong)*(uint *)(this->mBuffer + 8);
    local_46c = *(uint *)(this->mBuffer + 8) - 1;
    uVar35 = 0;
    local_480 = splitGroupData;
    do {
      ppvVar1 = local_480->aiSplit;
      pvVar2 = ppvVar1[uVar35];
      if ((pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start !=
          (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        paVar24 = (aiMesh *)operator_new(0x520);
        paVar24->mNumVertices = 0;
        paVar24->mNumFaces = 0;
        __s = &paVar24->mVertices;
        memset(__s,0,0xcc);
        paVar24->mBones = (aiBone **)0x0;
        paVar24->mMaterialIndex = 0;
        (paVar24->mName).length = 0;
        (paVar24->mName).data[0] = '\0';
        memset((paVar24->mName).data + 1,0x1b,0x3ff);
        paVar24->mNumAnimMeshes = 0;
        paVar24->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar24->mMethod = 0;
        (paVar24->mAABB).mMin.x = 0.0;
        (paVar24->mAABB).mMin.y = 0.0;
        (paVar24->mAABB).mMin.z = 0.0;
        (paVar24->mAABB).mMax.x = 0.0;
        (paVar24->mAABB).mMax.y = 0.0;
        (paVar24->mAABB).mMax.z = 0.0;
        memset(paVar24->mColors,0,0xa0);
        paVar24->mPrimitiveTypes = 4;
        paVar24->mMaterialIndex = (uint)uVar35;
        pvVar2 = ppvVar1[uVar35];
        uVar38 = (long)(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        uVar37 = (uint)uVar38;
        paVar24->mNumFaces = uVar37;
        uVar38 = uVar38 & 0xffffffff;
        local_498 = paVar24;
        local_488 = uVar35;
        puVar25 = (ulong *)operator_new__(uVar38 * 0x10 + 8);
        *puVar25 = uVar38;
        paVar26 = (aiFace *)(puVar25 + 1);
        if (uVar38 != 0) {
          paVar33 = paVar26;
          do {
            paVar33->mNumIndices = 0;
            paVar33->mIndices = (uint *)0x0;
            paVar33 = paVar33 + 1;
          } while (paVar33 != paVar26 + uVar38);
        }
        paVar24->mFaces = paVar26;
        paVar24->mNumVertices = uVar37 * 3;
        uVar35 = (ulong)(uVar37 * 3) * 0xc;
        paVar27 = (aiVector3D *)operator_new__(uVar35);
        if (uVar37 == 0) {
          *__s = paVar27;
          paVar27 = (aiVector3D *)operator_new__(uVar35);
        }
        else {
          __n = ((uVar35 - 0xc) / 0xc) * 0xc + 0xc;
          local_490 = uVar35;
          memset(paVar27,0,__n);
          uVar35 = local_490;
          *__s = paVar27;
          paVar27 = (aiVector3D *)operator_new__(local_490);
          memset(paVar27,0,__n);
        }
        paVar24->mNormals = paVar27;
        if ((groupData->vTextureCoords1).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (groupData->vTextureCoords1).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          paVar24->mNumUVComponents[0] = 2;
          paVar27 = (aiVector3D *)operator_new__(uVar35);
          if (uVar37 != 0) {
            memset(paVar27,0,((uVar35 - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar24->mTextureCoords[0] = paVar27;
          if ((groupData->vTextureCoords2).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (groupData->vTextureCoords2).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            paVar24->mNumUVComponents[1] = 2;
            paVar27 = (aiVector3D *)operator_new__(uVar35);
            if (uVar37 != 0) {
              memset(paVar27,0,((uVar35 - 0xc) / 0xc) * 0xc + 0xc);
            }
            paVar24->mTextureCoords[1] = paVar27;
          }
        }
        if (uVar37 != 0) {
          uVar35 = 0;
          uVar38 = 0;
          do {
            paVar24->mFaces[uVar35].mNumIndices = 3;
            puVar28 = (uint *)operator_new__(0xc);
            local_498->mFaces[uVar35].mIndices = puVar28;
            uVar37 = (local_480->aiSplit[local_488]->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar35];
            pIVar3 = (groupData->pcFaces).
                     super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar29 = 0;
            do {
              uVar23 = pIVar3[uVar37].mIndices[lVar29];
              paVar4 = (groupData->vPositions).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              paVar27 = local_498->mVertices;
              uVar36 = uVar38 + lVar29 & 0xffffffff;
              paVar27[uVar36].z = paVar4[uVar23].z;
              paVar4 = paVar4 + uVar23;
              fVar7 = paVar4->y;
              paVar27 = paVar27 + uVar36;
              paVar27->x = paVar4->x;
              paVar27->y = fVar7;
              paVar4 = (groupData->vNormals).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              paVar27 = local_498->mNormals;
              paVar27[uVar36].z = paVar4[uVar23].z;
              paVar4 = paVar4 + uVar23;
              fVar7 = paVar4->y;
              paVar27 = paVar27 + uVar36;
              paVar27->x = paVar4->x;
              paVar27->y = fVar7;
              paVar4 = (groupData->vTextureCoords1).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if (paVar4 != (groupData->vTextureCoords1).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                paVar27 = local_498->mTextureCoords[0];
                paVar27[uVar36].z = paVar4[uVar23].z;
                fVar7 = paVar4[uVar23].y;
                paVar27 = paVar27 + uVar36;
                paVar27->x = paVar4[uVar23].x;
                paVar27->y = fVar7;
                paVar4 = (groupData->vTextureCoords2).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                if (paVar4 != (groupData->vTextureCoords2).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish) {
                  paVar27 = local_498->mTextureCoords[1];
                  paVar27[uVar36].z = paVar4[uVar23].z;
                  fVar7 = paVar4[uVar23].y;
                  paVar27 = paVar27 + uVar36;
                  paVar27->x = paVar4[uVar23].x;
                  paVar27->y = fVar7;
                }
              }
              local_498->mFaces[uVar35].mIndices[lVar29] = (uint)(uVar38 + lVar29);
              lVar29 = lVar29 + 1;
            } while (lVar29 != 3);
            uVar35 = uVar35 + 1;
            uVar38 = (ulong)((int)uVar38 + 3);
            paVar24 = local_498;
          } while (uVar35 < local_498->mNumFaces);
        }
        uVar35 = local_488;
        if ((groupData->aiBones).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (groupData->aiBones).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_468.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_468.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_468.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::resize(&local_468,local_448);
          pvVar6 = local_468.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (local_498->mNumFaces != 0) {
            uVar38 = 0;
            iVar40 = 0;
            do {
              uVar36 = local_448;
              uVar37 = (local_480->aiSplit[uVar35]->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar38];
              pIVar3 = (groupData->pcFaces).
                       super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar29 = 0;
              do {
                uVar23 = (groupData->aiBones).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[pIVar3[uVar37].mIndices[lVar29]];
                if (uVar23 != 0xffffffff) {
                  if ((uint)uVar36 <= uVar23) {
                    this_01 = DefaultLogger::get();
                    Logger::error(this_01,
                                  "Bone index overflow. The bone index of a vertex exceeds the allowed range. "
                                 );
                    uVar23 = local_46c;
                  }
                  local_434 = iVar40 + (int)lVar29;
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  emplace_back<unsigned_int>
                            (local_468.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar23,&local_434);
                }
                lVar29 = lVar29 + 1;
              } while (lVar29 != 3);
              uVar38 = uVar38 + 1;
              iVar40 = iVar40 + 3;
              uVar35 = local_488;
              pvVar6 = local_468.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar38 < local_498->mNumFaces);
          }
          for (; pvVar22 = local_468.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
              pvVar39 = local_468.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start, paVar24 = local_498,
              pvVar6 != local_468.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish; pvVar6 = pvVar6 + 1) {
            if ((pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start !=
                (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              local_498->mNumBones = local_498->mNumBones + 1;
            }
          }
          ppaVar30 = (aiBone **)operator_new__((ulong)local_498->mNumBones << 3);
          paVar24->mBones = ppaVar30;
          if (pvVar39 != pvVar22) {
            local_490 = 0;
            do {
              if ((pvVar39->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_start !=
                  (pvVar39->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_finish) {
                paVar31 = (aiBone *)operator_new(0x450);
                (paVar31->mName).length = 0;
                local_478 = (paVar31->mName).data;
                (paVar31->mName).data[0] = '\0';
                memset((paVar31->mName).data + 1,0x1b,0x3ff);
                uVar35 = local_490;
                paVar31->mNumWeights = 0;
                paVar31->mWeights = (aiVertexWeight *)0x0;
                (paVar31->mOffsetMatrix).a1 = 1.0;
                (paVar31->mOffsetMatrix).a2 = 0.0;
                (paVar31->mOffsetMatrix).a3 = 0.0;
                (paVar31->mOffsetMatrix).a4 = 0.0;
                (paVar31->mOffsetMatrix).b1 = 0.0;
                (paVar31->mOffsetMatrix).b2 = 1.0;
                (paVar31->mOffsetMatrix).b3 = 0.0;
                (paVar31->mOffsetMatrix).b4 = 0.0;
                (paVar31->mOffsetMatrix).c1 = 0.0;
                (paVar31->mOffsetMatrix).c2 = 0.0;
                (paVar31->mOffsetMatrix).c3 = 1.0;
                (paVar31->mOffsetMatrix).c4 = 0.0;
                (paVar31->mOffsetMatrix).d1 = 0.0;
                (paVar31->mOffsetMatrix).d2 = 0.0;
                (paVar31->mOffsetMatrix).d3 = 0.0;
                (paVar31->mOffsetMatrix).d4 = 1.0;
                local_498->mBones[local_490] = paVar31;
                local_440 = local_450->apcOutBones;
                uVar37 = (local_440[local_490]->super_aiBone).mName.length;
                if (0x3fe < uVar37) {
                  uVar37 = 0x3ff;
                }
                uVar38 = (ulong)uVar37;
                local_434 = uVar37;
                memcpy(local_430,(local_440[local_490]->super_aiBone).mName.data,uVar38);
                local_430[uVar38] = 0;
                (paVar31->mName).length = uVar37;
                memcpy(local_478,local_430,uVar38);
                (paVar31->mName).data[uVar38] = '\0';
                pIVar5 = local_440[uVar35];
                fVar18 = (pIVar5->super_aiBone).mOffsetMatrix.a1;
                fVar19 = (pIVar5->super_aiBone).mOffsetMatrix.a2;
                fVar20 = (pIVar5->super_aiBone).mOffsetMatrix.a3;
                fVar21 = (pIVar5->super_aiBone).mOffsetMatrix.a4;
                fVar14 = (pIVar5->super_aiBone).mOffsetMatrix.b1;
                fVar15 = (pIVar5->super_aiBone).mOffsetMatrix.b2;
                fVar16 = (pIVar5->super_aiBone).mOffsetMatrix.b3;
                fVar17 = (pIVar5->super_aiBone).mOffsetMatrix.b4;
                fVar10 = (pIVar5->super_aiBone).mOffsetMatrix.c1;
                fVar11 = (pIVar5->super_aiBone).mOffsetMatrix.c2;
                fVar12 = (pIVar5->super_aiBone).mOffsetMatrix.c3;
                fVar13 = (pIVar5->super_aiBone).mOffsetMatrix.c4;
                fVar7 = (pIVar5->super_aiBone).mOffsetMatrix.d2;
                fVar8 = (pIVar5->super_aiBone).mOffsetMatrix.d3;
                fVar9 = (pIVar5->super_aiBone).mOffsetMatrix.d4;
                (paVar31->mOffsetMatrix).d1 = (pIVar5->super_aiBone).mOffsetMatrix.d1;
                (paVar31->mOffsetMatrix).d2 = fVar7;
                (paVar31->mOffsetMatrix).d3 = fVar8;
                (paVar31->mOffsetMatrix).d4 = fVar9;
                (paVar31->mOffsetMatrix).c1 = fVar10;
                (paVar31->mOffsetMatrix).c2 = fVar11;
                (paVar31->mOffsetMatrix).c3 = fVar12;
                (paVar31->mOffsetMatrix).c4 = fVar13;
                (paVar31->mOffsetMatrix).b1 = fVar14;
                (paVar31->mOffsetMatrix).b2 = fVar15;
                (paVar31->mOffsetMatrix).b3 = fVar16;
                (paVar31->mOffsetMatrix).b4 = fVar17;
                (paVar31->mOffsetMatrix).a1 = fVar18;
                (paVar31->mOffsetMatrix).a2 = fVar19;
                (paVar31->mOffsetMatrix).a3 = fVar20;
                (paVar31->mOffsetMatrix).a4 = fVar21;
                uVar35 = (long)(pvVar39->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar39->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 2;
                uVar37 = (uint)uVar35;
                paVar31->mNumWeights = uVar37;
                uVar35 = uVar35 & 0xffffffff;
                local_478 = (char *)(uVar35 * 8);
                __s_00 = (aiVertexWeight *)operator_new__((ulong)local_478);
                if (uVar35 != 0) {
                  memset(__s_00,0,(size_t)local_478);
                }
                paVar31->mWeights = __s_00;
                if (uVar37 != 0) {
                  uVar35 = 0;
                  do {
                    paVar31->mWeights[uVar35].mVertexId =
                         (pvVar39->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar35];
                    paVar31->mWeights[uVar35].mWeight = 1.0;
                    uVar35 = uVar35 + 1;
                  } while (uVar35 < paVar31->mNumWeights);
                }
              }
              pvVar39 = pvVar39 + 1;
              local_490 = local_490 + 1;
            } while (pvVar39 !=
                     local_468.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::~vector(&local_468);
        }
        uVar35 = local_488;
        this_00 = (vector<aiMesh*,std::allocator<aiMesh*>> *)local_480->avOutList;
        __position._M_current = *(aiMesh ***)(this_00 + 8);
        if (__position._M_current == *(aiMesh ***)(this_00 + 0x10)) {
          std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                    (this_00,__position,&local_498);
        }
        else {
          *__position._M_current = local_498;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
        ppaVar32 = (local_450->pcMats).
                   super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppaVar34 = (local_450->pcMats).
                   super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      uVar35 = uVar35 + 1;
    } while (uVar35 < (ulong)((long)ppaVar34 - (long)ppaVar32 >> 3));
  }
  return;
}

Assistant:

void MDLImporter::GenerateOutputMeshes_3DGS_MDL7(
    MDL::IntGroupData_MDL7& groupData,
    MDL::IntSplitGroupData_MDL7& splitGroupData)
{
    const MDL::IntSharedData_MDL7& shared = splitGroupData.shared;

    // get a pointer to the header ...
    const MDL::Header_MDL7* const pcHeader = (const MDL::Header_MDL7*)this->mBuffer;
    const unsigned int iNumOutBones = pcHeader->bones_num;

    for (std::vector<aiMaterial*>::size_type i = 0; i < shared.pcMats.size();++i)   {
        if (!splitGroupData.aiSplit[i]->empty())    {

            // allocate the output mesh
            aiMesh* pcMesh = new aiMesh();

            pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
            pcMesh->mMaterialIndex = (unsigned int)i;

            // allocate output storage
            pcMesh->mNumFaces = (unsigned int)splitGroupData.aiSplit[i]->size();
            pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];

            pcMesh->mNumVertices = pcMesh->mNumFaces*3;
            pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];
            pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];

            if (!groupData.vTextureCoords1.empty()) {
                pcMesh->mNumUVComponents[0] = 2;
                pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
                if (!groupData.vTextureCoords2.empty()) {
                    pcMesh->mNumUVComponents[1] = 2;
                    pcMesh->mTextureCoords[1] = new aiVector3D[pcMesh->mNumVertices];
                }
            }

            // iterate through all faces and build an unique set of vertices
            unsigned int iCurrent = 0;
            for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
                pcMesh->mFaces[iFace].mNumIndices = 3;
                pcMesh->mFaces[iFace].mIndices = new unsigned int[3];

                unsigned int iSrcFace = splitGroupData.aiSplit[i]->operator[](iFace);
                const MDL::IntFace_MDL7& oldFace = groupData.pcFaces[iSrcFace];

                // iterate through all face indices
                for (unsigned int c = 0; c < 3;++c) {
                    const uint32_t iIndex = oldFace.mIndices[c];
                    pcMesh->mVertices[iCurrent] = groupData.vPositions[iIndex];
                    pcMesh->mNormals[iCurrent] = groupData.vNormals[iIndex];

                    if (!groupData.vTextureCoords1.empty()) {

                        pcMesh->mTextureCoords[0][iCurrent] = groupData.vTextureCoords1[iIndex];
                        if (!groupData.vTextureCoords2.empty()) {
                            pcMesh->mTextureCoords[1][iCurrent] = groupData.vTextureCoords2[iIndex];
                        }
                    }
                    pcMesh->mFaces[iFace].mIndices[c] = iCurrent++;
                }
            }

            // if we have bones in the mesh we'll need to generate
            // proper vertex weights for them
            if (!groupData.aiBones.empty()) {
                std::vector<std::vector<unsigned int> > aaiVWeightList;
                aaiVWeightList.resize(iNumOutBones);

                int iCurrent = 0;
                for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
                    unsigned int iSrcFace = splitGroupData.aiSplit[i]->operator[](iFace);
                    const MDL::IntFace_MDL7& oldFace = groupData.pcFaces[iSrcFace];

                    // iterate through all face indices
                    for (unsigned int c = 0; c < 3;++c) {
                        unsigned int iBone = groupData.aiBones[ oldFace.mIndices[c] ];
                        if (UINT_MAX != iBone)  {
                            if (iBone >= iNumOutBones)  {
                                ASSIMP_LOG_ERROR("Bone index overflow. "
                                    "The bone index of a vertex exceeds the allowed range. ");
                                iBone = iNumOutBones-1;
                            }
                            aaiVWeightList[ iBone ].push_back ( iCurrent );
                        }
                        ++iCurrent;
                    }
                }
                // now check which bones are required ...
                for (std::vector<std::vector<unsigned int> >::const_iterator k =  aaiVWeightList.begin();k != aaiVWeightList.end();++k) {
                    if (!(*k).empty()) {
                        ++pcMesh->mNumBones;
                    }
                }
                pcMesh->mBones = new aiBone*[pcMesh->mNumBones];
                iCurrent = 0;
                for (std::vector<std::vector<unsigned int> >::const_iterator k = aaiVWeightList.begin();k!= aaiVWeightList.end();++k,++iCurrent)
                {
                    if ((*k).empty())
                        continue;

                    // seems we'll need this node
                    aiBone* pcBone = pcMesh->mBones[ iCurrent ] = new aiBone();
                    pcBone->mName = aiString(shared.apcOutBones[ iCurrent ]->mName);
                    pcBone->mOffsetMatrix = shared.apcOutBones[ iCurrent ]->mOffsetMatrix;

                    // setup vertex weights
                    pcBone->mNumWeights = (unsigned int)(*k).size();
                    pcBone->mWeights = new aiVertexWeight[pcBone->mNumWeights];

                    for (unsigned int weight = 0; weight < pcBone->mNumWeights;++weight)    {
                        pcBone->mWeights[weight].mVertexId = (*k)[weight];
                        pcBone->mWeights[weight].mWeight = 1.0f;
                    }
                }
            }
            // add the mesh to the list of output meshes
            splitGroupData.avOutList.push_back(pcMesh);
        }
    }
}